

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.hpp
# Opt level: O0

void __thiscall Movegen::generate<(Movetype)10,(Piece)6>(Movegen *this)

{
  bool bVar1;
  Movegen *this_local;
  
  if (this->check_target == 0) {
    generate<(Movetype)15,(Piece)0>(this);
    generate<(Movetype)10,(Piece)1>(this);
    generate<(Movetype)10,(Piece)2>(this);
    generate<(Movetype)10,(Piece)3>(this);
    generate<(Movetype)10,(Piece)4>(this);
    generate<(Movetype)10,(Piece)0>(this);
    generate<(Movetype)10,(Piece)5>(this);
    generate<(Movetype)13,(Piece)5>(this);
  }
  else if ((this->check_target == 0) || (this->evasion_target != 0)) {
    if ((this->check_target != 0) && (this->evasion_target != 0)) {
      bVar1 = bits::more_than_one(&this->check_target);
      if (!bVar1) {
        generate<(Movetype)10,(Piece)1>(this);
        generate<(Movetype)10,(Piece)2>(this);
        generate<(Movetype)10,(Piece)3>(this);
        generate<(Movetype)10,(Piece)4>(this);
        generate<(Movetype)15,(Piece)0>(this);
        generate<(Movetype)10,(Piece)0>(this);
      }
      generate<(Movetype)10,(Piece)5>(this);
    }
  }
  else {
    generate<(Movetype)10,(Piece)5>(this);
  }
  return;
}

Assistant:

inline void Movegen::generate<quiet, pieces>() {
	// todo: order move generation by game phase
	// data-driven approach for this?
	if (check_target == 0ULL) {
		generate<promotion, pawn>();
		generate<quiet, knight>();
		generate<quiet, bishop>();
		generate<quiet, rook>();
		generate<quiet, queen>();
		generate<quiet, pawn>();
		generate<quiet, king>();
		generate<castles, king>();
	}
	else if (check_target != 0ULL && evasion_target == 0ULL) {
		generate<quiet, king>();
	}
	else if (check_target != 0ULL && evasion_target != 0ULL) {
		if (!bits::more_than_one(check_target)) {
			generate<quiet, knight>();
			generate<quiet, bishop>();
			generate<quiet, rook>();
			generate<quiet, queen>();
			generate<promotion, pawn>();
			generate<quiet, pawn>();
		}
		generate<quiet, king>();
	}

}